

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::testBindingPoint
          (BuffersTest *this,GLuint index,GLint expected_value,GLchar *tested_function_name)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  GLint local_34;
  long lStack_30;
  GLint buffer_binding;
  Functions *gl;
  GLchar *tested_function_name_local;
  GLint expected_value_local;
  GLuint index_local;
  BuffersTest *this_local;
  
  gl = (Functions *)tested_function_name;
  tested_function_name_local._0_4_ = expected_value;
  tested_function_name_local._4_4_ = index;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = -1;
  (*this->m_gl_getTransformFeedbacki_v)
            (this->m_xfb_dsa,0x8c8f,tested_function_name_local._4_4_,&local_34);
  err = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(err,"glGetTransformFeedbacki_v have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x30c);
  if (local_34 == -1) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [138])
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has not returned anything and error has not been generated."
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_local._7_1_ = false;
  }
  else if ((GLint)tested_function_name_local == local_34) {
    this_local._7_1_ = true;
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_348,
                        (char (*) [92])
                        "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
                       );
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_34);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2a7e7ab);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&tested_function_name_local);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [41])" is expected. As a consequence function ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&gl);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [36])" have failed to setup proper value.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BuffersTest::testBindingPoint(glw::GLuint const index, glw::GLint const expected_value,
								   glw::GLchar const* const tested_function_name)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default binding points value. */
	glw::GLint buffer_binding = -1;

	m_gl_getTransformFeedbacki_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, index, &buffer_binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

	if (-1 == buffer_binding)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING "
										"has not returned anything and error has not been generated."
			<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != buffer_binding)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_BINDING has returned "
				<< buffer_binding << ", however " << expected_value << " is expected. As a consequence function "
				<< tested_function_name << " have failed to setup proper value." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}